

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SliceStaticLayerParams::SerializeWithCachedSizes
          (SliceStaticLayerParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  ulong *puVar4;
  int iVar5;
  int iVar6;
  byte *pbVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  bool *pbVar13;
  
  if (0 < (this->beginids_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar12 = this->_beginids_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->beginids_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->beginids_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar7 = pbVar1;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if (0 < (this->beginmasks_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
    }
    else {
      *output->buffer_ = '\x12';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar12 = this->_beginmasks_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
    pRVar2 = (this->beginmasks_).rep_;
    pbVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pbVar13 = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (pbVar13,(this->beginmasks_).current_size_,output);
  }
  if (0 < (this->endids_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x1a);
    }
    else {
      *output->buffer_ = '\x1a';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar12 = this->_endids_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->endids_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->endids_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar7 = pbVar1;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if (0 < (this->endmasks_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x22);
    }
    else {
      *output->buffer_ = '\"';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar12 = this->_endmasks_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
    pRVar2 = (this->endmasks_).rep_;
    pbVar13 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pbVar13 = (bool *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteBoolArray
              (pbVar13,(this->endmasks_).current_size_,output);
  }
  if (0 < (this->strides_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x2a);
    }
    else {
      *output->buffer_ = '*';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar12 = this->_strides_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar7 = pbVar1;
      uVar8 = uVar12;
      if (0x7f < uVar12) {
        do {
          *pbVar7 = (byte)uVar12 | 0x80;
          uVar8 = uVar12 >> 7;
          pbVar7 = pbVar7 + 1;
          bVar3 = 0x3fff < uVar12;
          uVar12 = uVar8;
        } while (bVar3);
      }
      *pbVar7 = (byte)uVar8;
      iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar5;
      output->buffer_size_ = output->buffer_size_ - iVar5;
    }
  }
  iVar5 = (this->strides_).current_size_;
  if (0 < iVar5) {
    iVar11 = 0;
    do {
      puVar4 = (ulong *)google::protobuf::RepeatedField<long>::Get(&this->strides_,iVar11);
      uVar10 = *puVar4;
      if (output->buffer_size_ < 10) {
        google::protobuf::io::CodedOutputStream::WriteVarint64SlowPath(output,uVar10);
      }
      else {
        pbVar1 = output->buffer_;
        pbVar7 = pbVar1;
        uVar9 = uVar10;
        if (0x7f < uVar10) {
          do {
            *pbVar7 = (byte)uVar10 | 0x80;
            uVar9 = uVar10 >> 7;
            pbVar7 = pbVar7 + 1;
            bVar3 = 0x3fff < uVar10;
            uVar10 = uVar9;
          } while (bVar3);
        }
        *pbVar7 = (byte)uVar9;
        iVar6 = ((int)pbVar7 - (int)pbVar1) + 1;
        output->buffer_ = output->buffer_ + iVar6;
        output->buffer_size_ = output->buffer_size_ - iVar6;
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar5);
  }
  if ((this->squeezemasks_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x32);
  }
  else {
    *output->buffer_ = '2';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  uVar12 = this->_squeezemasks_cached_byte_size_;
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar12);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar7 = pbVar1;
    uVar8 = uVar12;
    if (0x7f < uVar12) {
      do {
        *pbVar7 = (byte)uVar12 | 0x80;
        uVar8 = uVar12 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0x3fff < uVar12;
        uVar12 = uVar8;
      } while (bVar3);
    }
    *pbVar7 = (byte)uVar8;
    iVar5 = ((int)pbVar7 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar5;
    output->buffer_size_ = output->buffer_size_ - iVar5;
  }
  pRVar2 = (this->squeezemasks_).rep_;
  pbVar13 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    pbVar13 = (bool *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteBoolArray
            (pbVar13,(this->squeezemasks_).current_size_,output);
  return;
}

Assistant:

void SliceStaticLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceStaticLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 beginIds = 1;
  if (this->beginids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginids_cached_byte_size_);
  }
  for (int i = 0, n = this->beginids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->beginids(i), output);
  }

  // repeated bool beginMasks = 2;
  if (this->beginmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_beginmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->beginmasks().data(), this->beginmasks_size(), output);
  }

  // repeated int64 endIds = 3;
  if (this->endids_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endids_cached_byte_size_);
  }
  for (int i = 0, n = this->endids_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->endids(i), output);
  }

  // repeated bool endMasks = 4;
  if (this->endmasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(4, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_endmasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->endmasks().data(), this->endmasks_size(), output);
  }

  // repeated int64 strides = 5;
  if (this->strides_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(5, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_strides_cached_byte_size_);
  }
  for (int i = 0, n = this->strides_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64NoTag(
      this->strides(i), output);
  }

  // repeated bool squeezeMasks = 6;
  if (this->squeezemasks_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(6, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_squeezemasks_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->squeezemasks().data(), this->squeezemasks_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceStaticLayerParams)
}